

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int send_max_streams(quicly_conn_t *conn,int uni,quicly_send_context_t *s)

{
  uint64_t *puVar1;
  uint uVar2;
  long lVar3;
  byte *pbVar4;
  int iVar5;
  uint8_t *puVar6;
  uint64_t uVar7;
  bool bVar8;
  quicly_sent_t *sent;
  
  iVar5 = should_send_max_streams(conn,uni);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    bVar8 = uni != 0;
    uVar7 = (&(((conn->super).ctx)->transport_params).max_streams_bidi)[bVar8];
    lVar3 = (&(conn->super).remote.bidi)[bVar8].next_stream_id;
    uVar2 = (&(conn->super).remote.bidi)[bVar8].num_streams;
    iVar5 = allocate_ack_eliciting_frame(conn,s,9,&sent,on_ack_max_streams);
    if (iVar5 == 0) {
      bVar8 = uni == 0;
      uVar7 = (uVar7 + lVar3 / 4) - (ulong)uVar2;
      pbVar4 = s->dst;
      *pbVar4 = bVar8 ^ 0x13;
      puVar6 = ptls_encode_quicint(pbVar4 + 1,uVar7);
      s->dst = puVar6;
      (sent->data).max_streams.uni = uni;
      quicly_maxsender_record
                ((quicly_maxsender_t *)
                 ((conn->egress).loss.largest_acked_packet_plus1 + (ulong)bVar8 * 4 + -0xe),uVar7,
                 &(sent->data).max_stream_data.args);
      puVar1 = &(conn->super).stats.num_frames_sent.max_streams_bidi + !bVar8;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar5;
}

Assistant:

static int send_max_streams(quicly_conn_t *conn, int uni, quicly_send_context_t *s)
{
    if (!should_send_max_streams(conn, uni))
        return 0;

    quicly_maxsender_t *maxsender = uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
    struct st_quicly_conn_streamgroup_state_t *group = uni ? &conn->super.remote.uni : &conn->super.remote.bidi;
    int ret;

    uint64_t new_count =
        group->next_stream_id / 4 +
        (uni ? conn->super.ctx->transport_params.max_streams_uni : conn->super.ctx->transport_params.max_streams_bidi) -
        group->num_streams;

    quicly_sent_t *sent;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_MAX_STREAMS_FRAME_CAPACITY, &sent, on_ack_max_streams)) != 0)
        return ret;
    s->dst = quicly_encode_max_streams_frame(s->dst, uni, new_count);
    sent->data.max_streams.uni = uni;
    quicly_maxsender_record(maxsender, new_count, &sent->data.max_streams.args);

    if (uni) {
        ++conn->super.stats.num_frames_sent.max_streams_uni;
    } else {
        ++conn->super.stats.num_frames_sent.max_streams_bidi;
    }
    QUICLY_PROBE(MAX_STREAMS_SEND, conn, conn->stash.now, new_count, uni);

    return 0;
}